

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector.h
# Opt level: O1

bool __thiscall
prevector<28U,_unsigned_char,_unsigned_int,_int>::operator<
          (prevector<28U,_unsigned_char,_unsigned_int,_int> *this,
          prevector<28U,_unsigned_char,_unsigned_int,_int> *other)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  long in_FS_OFFSET;
  bool bVar6;
  bool bVar7;
  
  uVar1 = this->_size;
  uVar3 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar3 = uVar1;
  }
  uVar2 = other->_size;
  uVar4 = uVar2 - 0x1d;
  if (uVar2 < 0x1d) {
    uVar4 = uVar2;
  }
  bVar6 = true;
  if (uVar4 <= uVar3) {
    if (uVar3 <= uVar4) {
      if (0x1c < uVar1) {
        this = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
               (this->_union).indirect_contents.indirect;
      }
      if (uVar3 != 0) {
        if (0x1c < uVar2) {
          other = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                  (other->_union).indirect_contents.indirect;
        }
        lVar5 = 0;
        do {
          bVar6 = (byte)(this->_union).direct[lVar5] < (byte)(other->_union).direct[lVar5];
          if ((bVar6) || (!bVar6 && (this->_union).direct[lVar5] != (other->_union).direct[lVar5]))
          break;
          bVar7 = (long)(int)uVar3 + -1 != lVar5;
          lVar5 = lVar5 + 1;
        } while (bVar7);
        goto LAB_00a0157d;
      }
    }
    bVar6 = false;
  }
LAB_00a0157d:
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return bVar6;
}

Assistant:

bool operator<(const prevector<N, T, Size, Diff>& other) const {
        if (size() < other.size()) {
            return true;
        }
        if (size() > other.size()) {
            return false;
        }
        const_iterator b1 = begin();
        const_iterator b2 = other.begin();
        const_iterator e1 = end();
        while (b1 != e1) {
            if ((*b1) < (*b2)) {
                return true;
            }
            if ((*b2) < (*b1)) {
                return false;
            }
            ++b1;
            ++b2;
        }
        return false;
    }